

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_walk_node.cpp
# Opt level: O0

void __thiscall random_walk_node::run(random_walk_node *this)

{
  _Setiosflags _Var1;
  vec3 *pvVar2;
  result_type rVar3;
  rep_conflict rVar4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_138;
  rep_conflict local_130;
  rep local_128;
  rep local_120;
  duration<long,_std::ratio<1L,_1000000000L>_> local_118;
  rep_conflict local_110;
  rep local_108;
  duration<long,_std::ratio<1L,_1000000000L>_> local_100;
  duration<double,std::ratio<1l,1000000l>> local_f8 [8];
  rep local_f0;
  undefined8 local_e4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_dc;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d8;
  duration local_d0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c8;
  time_point currentTime;
  time_point lastShow;
  time_point lastUpdate;
  time_point lastChange;
  time_point baseTime;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_98;
  time_point loopEndTime;
  duration<double,_std::ratio<1L,_1000000L>_> wholeTime;
  duration<double,_std::ratio<1L,_1000000L>_> changeTime;
  duration<double,_std::ratio<1L,_1000000L>_> loopTime;
  duration<double,_std::ratio<1L,_1000000L>_> tmpTime;
  uniform_real_distribution<double> randomPitch;
  uniform_real_distribution<double> randomDir;
  uniform_real_distribution<double> randomVel;
  uniform_real_distribution<double> randomZ;
  uniform_real_distribution<double> randomY;
  uniform_real_distribution<double> randomX;
  random_walk_node *this_local;
  
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&randomY._M_param._M_b,XMIN,XMAX);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&randomZ._M_param._M_b,YMIN,YMAX);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&randomVel._M_param._M_b,ZMIN,ZMAX);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&randomDir._M_param._M_b,VMIN,VMAX);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,0.0,6.283185307179586);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&tmpTime,0.0,3.141592653589793);
  rVar3 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)&randomY._M_param._M_b,&e);
  (this->super_node).x = rVar3;
  rVar3 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)&randomZ._M_param._M_b,&e);
  (this->super_node).y = rVar3;
  rVar3 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)&randomVel._M_param._M_b,&e);
  (this->super_node).z = rVar3;
  rVar3 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)&randomDir._M_param._M_b,&e);
  (this->super_node).v = rVar3;
  rVar3 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,&e);
  (this->super_node).d = rVar3;
  rVar3 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)&tmpTime,&e);
  (this->super_node).p = rVar3;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_98);
  _Var1 = std::setiosflags(_S_fixed);
  std::operator<<((ostream *)&std::cout,_Var1);
  lastChange.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  currentTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  lastShow.__d.__r = currentTime.__d.__r;
  lastUpdate.__d.__r = currentTime.__d.__r;
  local_c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_d8.__r = (rep)std::chrono::operator-(&local_c8,&lastChange);
  std::chrono::duration<double,std::ratio<1l,1000000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000000l>> *)&local_d0,&local_d8);
  loopEndTime.__d.__r = (duration)(duration)local_d0.__r;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_e4,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  pvVar2 = points + (this->super_node).id;
  pvVar2->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_e4;
  pvVar2->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e4._4_4_;
  pvVar2->field_2 = local_dc;
  node::calc(&this->super_node,(this->super_node).id,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  while ((running & 1U) == 1) {
    local_f0 = std::chrono::_V2::system_clock::now();
    local_c8.__d.__r = (duration)(duration)local_f0;
    local_100.__r = (rep)std::chrono::operator-(&local_c8,&currentTime);
    std::chrono::duration<double,std::ratio<1l,1000000l>>::
    duration<long,std::ratio<1l,1000000000l>,void>(local_f8,&local_100);
    local_108 = std::chrono::_V2::system_clock::now();
    if (((this->super_node).first & 1U) != 0) {
      (this->super_node).first = false;
      lastShow.__d.__r = (duration)(duration)local_108;
      lastUpdate.__d.__r = (duration)(duration)local_108;
    }
    local_98.__d.__r = (duration)(duration)local_108;
    local_118.__r = (rep)std::chrono::operator-(&local_98,&lastShow);
    std::chrono::duration<double,std::ratio<1l,1000000l>>::
    duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1000000l>> *)&local_110,&local_118);
    changeTime.__r = local_110;
    rVar4 = std::chrono::duration<double,_std::ratio<1L,_1000000L>_>::count(&changeTime);
    update(this,rVar4 / 1000000.0);
    local_120 = std::chrono::_V2::system_clock::now();
    lastShow.__d.__r = (duration)(duration)local_120;
    local_128 = std::chrono::_V2::system_clock::now();
    local_c8.__d.__r = (duration)(duration)local_128;
    local_138.__r = (rep)std::chrono::operator-(&local_c8,&lastUpdate);
    std::chrono::duration<double,std::ratio<1l,1000000l>>::
    duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1000000l>> *)&local_130,&local_138);
    wholeTime.__r = local_130;
    rVar4 = std::chrono::duration<double,_std::ratio<1L,_1000000L>_>::count(&wholeTime);
    if (interval * 1000000.0 < rVar4) {
      lastUpdate.__d.__r = local_c8.__d.__r;
      rVar3 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)&randomDir._M_param._M_b,&e);
      node::setv(&this->super_node,rVar3);
      rVar3 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,&e);
      node::setd(&this->super_node,rVar3);
      rVar3 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)&tmpTime,&e);
      node::setp(&this->super_node,rVar3);
      (this->super_node).lastErr = 0;
    }
    usleep(1000);
  }
  return;
}

Assistant:

void random_walk_node::run(){
    uniform_real_distribution<double> randomX(XMIN,XMAX);
    uniform_real_distribution<double> randomY(YMIN,YMAX);
    uniform_real_distribution<double> randomZ(ZMIN,ZMAX);
    uniform_real_distribution<double> randomVel(VMIN,VMAX);
    uniform_real_distribution<double> randomDir(0,2*M_PI);
    uniform_real_distribution<double> randomPitch(0,M_PI);
    x = randomX(e);
    y = randomY(e);
    z = randomZ(e);
    v = randomVel(e);
    d = randomDir(e);
    p = randomPitch(e);
    std::chrono::duration<double, std::micro> tmpTime;     //Time between current and lastshow
    std::chrono::duration<double, std::micro> loopTime;    //Time used for a single loop
    std::chrono::duration<double, std::micro> changeTime;
    std::chrono::duration<double, std::micro> wholeTime;
    high_resolution_clock::time_point loopEndTime;
    cout<<setiosflags(ios::fixed);
    high_resolution_clock::time_point baseTime = high_resolution_clock::now();
    high_resolution_clock::time_point lastChange = high_resolution_clock::now();    //Time when random_walk_node info changed
    high_resolution_clock::time_point  lastUpdate = lastChange;   //Time when random_walk_node loc updated
    high_resolution_clock::time_point lastShow = lastUpdate;    //Time when random_walk_node info shown
    high_resolution_clock::time_point currentTime = high_resolution_clock::now();
    wholeTime = currentTime-baseTime;
    //printf("ID=%d\t\tX=%f\t\tY=%f\t\tZ=%f\n",this->id,this->x,this->y,this->z);
    points[this->id] = glm::vec3(this->x, this->y, this->z);
    calc(this->id, this->x, this->y, this->z);    //这句是将xyz转换为wgs84坐标系
    //initial output
    while(running == true){
        currentTime = high_resolution_clock::now();
        tmpTime = (currentTime-lastShow);
        loopEndTime = high_resolution_clock::now();
        if (first) {
            lastUpdate = loopEndTime;
            lastChange = loopEndTime;
            first = false;
        }
        loopTime=(loopEndTime-lastUpdate);
        this->update(loopTime.count()/1e6);
        lastUpdate = high_resolution_clock::now();
        currentTime = high_resolution_clock::now();
        changeTime = currentTime-lastChange;
        if(changeTime.count() > interval*1e6){       //Regenerate random_walk_node info every $timeout second
            lastChange = currentTime;
            this->setv(randomVel(e));
            this->setd(randomDir(e));
            this->setp(randomPitch(e));
            lastErr = 0;                //To avoid random_walk_node bouncing near the edge
        }
        usleep(1000);
    }
}